

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

Time absl::FromUniversal(int64_t universal)

{
  undefined8 in_RCX;
  Time TVar1;
  Duration DVar2;
  Time TVar3;
  Time lhs;
  Duration rhs;
  Duration rhs_00;
  int64_t universal_local;
  
  TVar1 = UniversalEpoch();
  DVar2 = Nanoseconds<long,_0>(universal);
  rhs.rep_hi_ = (ulong)DVar2.rep_lo_;
  rhs._8_8_ = in_RCX;
  DVar2 = operator*((absl *)0x64,(int)DVar2.rep_hi_,rhs);
  lhs.rep_._12_4_ = 0;
  lhs.rep_.rep_hi_ = SUB128(TVar1.rep_._0_12_,0);
  lhs.rep_.rep_lo_ = SUB124(TVar1.rep_._0_12_,8);
  rhs_00._12_4_ = 0;
  rhs_00.rep_hi_ = SUB128(DVar2._0_12_,0);
  rhs_00.rep_lo_ = SUB124(DVar2._0_12_,8);
  TVar1 = operator+(lhs,rhs_00);
  TVar3.rep_._12_4_ = 0;
  TVar3.rep_.rep_hi_ = SUB128(TVar1.rep_._0_12_,0);
  TVar3.rep_.rep_lo_ = SUB124(TVar1.rep_._0_12_,8);
  return (Time)TVar3.rep_;
}

Assistant:

absl::Time FromUniversal(int64_t universal) {
  return absl::UniversalEpoch() + 100 * absl::Nanoseconds(universal);
}